

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_err.cpp
# Opt level: O0

void CliWoption(char *option)

{
  bool bVar1;
  int iVar2;
  bool *pbVar3;
  reference v;
  bool bVar4;
  char *local_60;
  char *local_58;
  _Self local_50;
  _Self local_48;
  iterator warning_it;
  pair<const_char_*const,_WarningEntry> *warning_entry;
  iterator __end2;
  iterator __begin2;
  messages_map *__range2;
  char *id;
  bool enable;
  char *option_local;
  
  if (*option == '\0') {
    if (pass == 0) {
      local_58 = (char *)0x0;
    }
    else {
      local_58 = bp;
    }
    Error("no argument after -W",local_58,PASS03);
  }
  else {
    iVar2 = strncmp("no-",option,3);
    bVar4 = iVar2 != 0;
    local_60 = option;
    if (!bVar4) {
      local_60 = option + 3;
    }
    iVar2 = strcmp(local_60,W_ENABLE_ALL);
    if (iVar2 == 0) {
      __end2 = std::
               map<const_char_*,_WarningEntry,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_WarningEntry>_>_>
               ::begin(&w_texts);
      warning_entry =
           (pair<const_char_*const,_WarningEntry> *)
           std::
           map<const_char_*,_WarningEntry,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_WarningEntry>_>_>
           ::end(&w_texts);
      while (bVar1 = std::operator!=(&__end2,(_Self *)&warning_entry), bVar1) {
        warning_it._M_node =
             (_Base_ptr)
             std::_Rb_tree_iterator<std::pair<const_char_*const,_WarningEntry>_>::operator*(&__end2)
        ;
        pbVar3 = warning_state((value_type *)warning_it._M_node);
        *pbVar3 = bVar4;
        std::_Rb_tree_iterator<std::pair<const_char_*const,_WarningEntry>_>::operator++(&__end2);
      }
    }
    else {
      local_48._M_node = (_Base_ptr)findWarningByIdText(local_60);
      local_50._M_node =
           (_Base_ptr)
           std::
           map<const_char_*,_WarningEntry,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_WarningEntry>_>_>
           ::end(&w_texts);
      bVar1 = std::operator==(&local_50,&local_48);
      if (bVar1) {
        Warning("unknown warning id in -W option",local_60,W_PASS03);
      }
      else {
        v = std::_Rb_tree_iterator<std::pair<const_char_*const,_WarningEntry>_>::operator*
                      (&local_48);
        pbVar3 = warning_state(v);
        *pbVar3 = bVar4;
      }
    }
  }
  return;
}

Assistant:

void CliWoption(const char* option) {
	if (!option[0]) {
		// from command line 0 == pass, from source by OPT the pass is above zero
		Error("no argument after -W", (0 == pass) ? nullptr : bp, PASS03);
		return;
	}
	// check for specific id, with possible "no-" prefix ("-Wabs" vs "-Wno-abs")
	const bool enable = strncmp("no-", option, 3);
	const char* id = enable ? option : option + 3;
	// handle ID "all"
	if (!strcmp(id, W_ENABLE_ALL)) {
		for (auto & warning_entry : w_texts) warning_state(warning_entry) = enable;
		return;
	}
	auto warning_it = findWarningByIdText(id);
	if (w_texts.end() == warning_it) {
		Warning("unknown warning id in -W option", id, W_PASS03);
		return;
	}
	warning_state(*warning_it) = enable;
}